

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hnsw.hpp
# Opt level: O2

void __thiscall hnsw::HNSWIndex::LoadIndex(HNSWIndex *this,char *filename)

{
  int iVar1;
  pointer pVVar2;
  undefined1 auVar3 [16];
  vector<hnsw::HNSWIndex::Vertex,_std::allocator<hnsw::HNSWIndex::Vertex>_> *pvVar4;
  uint32_t j;
  uint uVar5;
  int i;
  uint32_t *puVar6;
  ulong uVar7;
  vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>> *this_00;
  undefined8 extraout_XMM1_Qa;
  undefined1 extraout_var [56];
  index_t idx;
  index_t num_neighbors;
  long local_2f8;
  HNSWIndex *local_2f0;
  uint local_2e4;
  float local_2e0;
  index_t edge;
  long local_2d8;
  long local_2d0;
  vector<hnsw::HNSWIndex::Vertex,_std::allocator<hnsw::HNSWIndex::Vertex>_> *local_2c8;
  vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>> *local_2c0;
  int layers [32];
  ifstream is;
  undefined1 auVar9 [64];
  undefined1 auVar8 [16];
  
  printf("Loading index from %s\n");
  std::ifstream::ifstream(&is,filename,_S_in|_S_bin);
  puVar6 = &this->num_points_;
  std::istream::read((char *)&is,(long)puVar6);
  local_2c8 = &this->vertices_;
  std::vector<hnsw::HNSWIndex::Vertex,_std::allocator<hnsw::HNSWIndex::Vertex>_>::resize
            (local_2c8,(ulong)this->num_points_);
  local_2f8 = 0;
  layers[0x10] = 0;
  layers[0x11] = 0;
  layers[0x12] = 0;
  layers[0x13] = 0;
  layers[0x14] = 0;
  layers[0x15] = 0;
  layers[0x16] = 0;
  layers[0x17] = 0;
  layers[0x18] = 0;
  layers[0x19] = 0;
  layers[0x1a] = 0;
  layers[0x1b] = 0;
  layers[0x1c] = 0;
  layers[0x1d] = 0;
  layers[0x1e] = 0;
  layers[0x1f] = 0;
  layers[0] = 0;
  layers[1] = 0;
  layers[2] = 0;
  layers[3] = 0;
  layers[4] = 0;
  layers[5] = 0;
  layers[6] = 0;
  layers[7] = 0;
  layers[8] = 0;
  layers[9] = 0;
  layers[10] = 0;
  layers[0xb] = 0;
  layers[0xc] = 0;
  layers[0xd] = 0;
  layers[0xe] = 0;
  layers[0xf] = 0;
  this->ep_ = 0;
  this->top_layer_ = 0;
  local_2d8 = 0;
  local_2f0 = this;
  for (local_2e4 = 0; local_2e4 < *puVar6; local_2e4 = local_2e4 + 1) {
    std::istream::read((char *)&is,(long)&idx);
    pvVar4 = local_2c8;
    std::istream::read((char *)&is,
                       (long)&(local_2c8->
                              super__Vector_base<hnsw::HNSWIndex::Vertex,_std::allocator<hnsw::HNSWIndex::Vertex>_>
                              )._M_impl.super__Vector_impl_data._M_start[idx].layer);
    pVVar2 = (pvVar4->
             super__Vector_base<hnsw::HNSWIndex::Vertex,_std::allocator<hnsw::HNSWIndex::Vertex>_>).
             _M_impl.super__Vector_impl_data._M_start;
    std::
    vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
    ::resize(&pVVar2[idx].neighbors,(long)pVVar2[idx].layer + 1);
    uVar7 = (ulong)idx;
    pVVar2 = (pvVar4->
             super__Vector_base<hnsw::HNSWIndex::Vertex,_std::allocator<hnsw::HNSWIndex::Vertex>_>).
             _M_impl.super__Vector_impl_data._M_start;
    local_2d0 = 0;
    local_2c0 = *(vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>
                  **)((long)&pVVar2[uVar7].neighbors.
                             super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                             ._M_impl + 8);
    local_2f8 = (long)pVVar2[uVar7].layer + 1 + local_2f8;
    for (this_00 = *(vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>
                     **)&pVVar2[uVar7].neighbors.
                         super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                         ._M_impl; this_00 != local_2c0; this_00 = this_00 + 0x18) {
      std::istream::read((char *)&is,(long)&num_neighbors);
      std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
      ::reserve((vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                 *)this_00,(ulong)num_neighbors);
      uVar5 = 0;
      while( true ) {
        if (num_neighbors <= uVar5) break;
        std::istream::read((char *)&is,(long)&edge);
        local_2e0 = 0.0;
        std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>::
        emplace_back<unsigned_int&,float>(this_00,&edge,&local_2e0);
        if (*puVar6 <= edge) {
          puts("Data corrupted");
        }
        uVar5 = uVar5 + 1;
      }
      local_2d8 = local_2d8 + (ulong)num_neighbors;
      layers[local_2d0] = layers[local_2d0] + 1;
      local_2d0 = local_2d0 + 1;
    }
    iVar1 = (local_2f0->vertices_).
            super__Vector_base<hnsw::HNSWIndex::Vertex,_std::allocator<hnsw::HNSWIndex::Vertex>_>.
            _M_impl.super__Vector_impl_data._M_start[idx].layer;
    if (local_2f0->top_layer_ < iVar1) {
      local_2f0->top_layer_ = iVar1;
      local_2f0->ep_ = idx;
    }
  }
  std::ifstream::close();
  auVar9._8_56_ = extraout_var;
  auVar9._0_8_ = extraout_XMM1_Qa;
  auVar8 = auVar9._0_16_;
  printf("Loaded %u points into index\n",(ulong)*puVar6);
  auVar3 = vcvtusi2sd_avx512f(auVar8,local_2d8);
  auVar8 = vcvtusi2sd_avx512f(auVar8,*puVar6);
  printf("Total layers: %lu, avg out degrees: %f\n",auVar3._0_8_ / auVar8._0_8_,local_2f8);
  for (uVar7 = 0; (long)uVar7 <= (long)local_2f0->top_layer_; uVar7 = uVar7 + 1) {
    printf("Layer %d: %d\n",uVar7 & 0xffffffff,(ulong)(uint)layers[uVar7]);
  }
  std::ifstream::~ifstream(&is);
  return;
}

Assistant:

void LoadIndex(const char *filename) {
    printf("Loading index from %s\n", filename);

    std::ifstream is(filename, std::ios::binary | std::ios::in);
    is.read((char *)&num_points_, sizeof(index_t));
    vertices_.resize(num_points_);

    int layers[32];
    memset(layers, 0, sizeof(layers));
    size_t num_layers = 0, out_degrees = 0;

    ep_ = 0;
    top_layer_ = 0;
    for (uint32_t i = 0; i < num_points_; i++) {
      index_t idx;
      is.read((char *)&idx, sizeof(index_t));
      is.read((char *)&vertices_[idx].layer, sizeof(layer_t));
      vertices_[idx].neighbors.resize(vertices_[idx].layer + 1);

      num_layers += vertices_[idx].layer + 1;

      layer_t layer = 0;
      for (auto &neighbors : vertices_[idx].neighbors) {
        index_t num_neighbors;
        is.read((char *)&num_neighbors, sizeof(index_t));
        neighbors.reserve(num_neighbors);
        for (uint32_t j = 0; j < num_neighbors; j++) {
          index_t edge;
          is.read((char *)&edge, sizeof(index_t));
          neighbors.emplace_back(edge, 0.0f);
          if (edge >= num_points_) {
            printf("Data corrupted\n");
          }
        }
        // is.read((char *)neighbors.data(), sizeof(Point) * num_neighbors);
        out_degrees += num_neighbors;
        layers[layer++] += 1;
      }

      if (vertices_[idx].layer > top_layer_) {
        top_layer_ = vertices_[idx].layer;
        ep_ = idx;
      }
    }
    is.close();
    printf("Loaded %u points into index\n", num_points_);
    printf("Total layers: %lu, avg out degrees: %f\n", num_layers, 1.0 * out_degrees / num_points_);
    for (int i = 0; i <= top_layer_; i++) {
      printf("Layer %d: %d\n", i, layers[i]);
    }
  }